

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O3

void CheckLink(TidyDocImpl *doc,Node *node)

{
  bool bVar1;
  bool bVar2;
  Bool BVar3;
  TidyAttrId TVar4;
  ctmbstr ptVar5;
  AttVal *pAVar6;
  ctmbstr cp;
  char *pcVar7;
  
  if ((0xfffffffc < (doc->access).PRIORITYCHK - 4U) &&
     (pAVar6 = node->attributes, pAVar6 != (AttVal *)0x0)) {
    bVar2 = false;
    bVar1 = false;
    do {
      if (pAVar6->dict != (Attribute *)0x0) {
        TVar4 = pAVar6->dict->id;
        if (TVar4 == TidyAttr_REL) {
          pcVar7 = pAVar6->value;
          if (pcVar7 != (char *)0x0) {
            do {
              if (*pcVar7 == '\0') goto LAB_0015530f;
              BVar3 = prvTidyIsWhite((int)*pcVar7);
              pcVar7 = pcVar7 + 1;
            } while (BVar3 != no);
            if (pAVar6->value != (ctmbstr)0x0) {
              ptVar5 = prvTidytmbsubstr(pAVar6->value,"stylesheet");
              if (ptVar5 != (ctmbstr)0x0) {
                bVar1 = true;
              }
            }
          }
LAB_0015530f:
          if (pAVar6->dict == (Attribute *)0x0) goto LAB_00155345;
          TVar4 = pAVar6->dict->id;
        }
        if ((TVar4 == TidyAttr_TYPE) && (pcVar7 = pAVar6->value, pcVar7 != (char *)0x0)) {
          do {
            if (*pcVar7 == '\0') goto LAB_00155345;
            BVar3 = prvTidyIsWhite((int)*pcVar7);
            pcVar7 = pcVar7 + 1;
          } while (BVar3 != no);
          bVar2 = true;
        }
      }
LAB_00155345:
      pAVar6 = pAVar6->next;
    } while (pAVar6 != (AttVal *)0x0);
    if (bVar2 && bVar1) {
      prvTidyReportAccessError(doc,node,0x2d0);
      return;
    }
  }
  return;
}

Assistant:

static void CheckLink( TidyDocImpl* doc, Node* node )
{
    Bool HasRel = no;
    Bool HasType = no;

    if (Level1_Enabled( doc ))
    {
        AttVal* av;
        /* Check for valid 'REL' and 'TYPE' attribute */
        for (av = node->attributes; av != NULL; av = av->next)
        {
            if ( attrIsREL(av) && hasValue(av) )
            {
                if (AttrContains(av, "stylesheet"))
                    HasRel = yes;
            }

            if ( attrIsTYPE(av) && hasValue(av) )
            {
                HasType = yes;
            }
        }

        if (HasRel && HasType)
            TY_(ReportAccessError)( doc, node, STYLESHEETS_REQUIRE_TESTING_LINK );
    }
}